

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O3

void dlib::cpu::ttimpl::softmax_gradient
               (long num_locations,long num_channels,tensor *grad,tensor *dest,
               tensor *gradient_input,operation_mode mode)

{
  long lVar1;
  uint *puVar2;
  long lVar3;
  long lVar4;
  undefined1 auVar5 [16];
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar7;
  long lVar8;
  ostream *poVar9;
  fatal_error *pfVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  undefined1 auVar22 [16];
  ostringstream dlib_o_out;
  long local_210;
  long local_208;
  long local_200;
  string local_1c8;
  long local_1a8 [3];
  uint auStack_190 [88];
  
  if ((((grad->m_n != dest->m_n) || (grad->m_k != dest->m_k)) || (grad->m_nr != dest->m_nr)) ||
     (grad->m_nc != dest->m_nc)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\n\nError detected at line ",0x19);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,0x6aa);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,".\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Error detected in file ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Error detected in function ",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "void dlib::cpu::ttimpl::softmax_gradient(const long, const long, tensor &, const tensor &, const tensor &, operation_mode)"
               ,0x7a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".\n\n",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Failing expression was ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"have_same_dimensions(grad, dest)",0x20);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".\n",2);
    puVar2 = (uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18));
    *puVar2 = *puVar2 | 1;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"",0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    pfVar10 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(pfVar10,EBROKEN_ASSERT,&local_1c8);
    __cxa_throw(pfVar10,&fatal_error::typeinfo,error::~error);
  }
  if (((grad->m_n == gradient_input->m_n) && (grad->m_k == gradient_input->m_k)) &&
     ((grad->m_nr == gradient_input->m_nr && (grad->m_nc == gradient_input->m_nc)))) {
    iVar6 = (*dest->_vptr_tensor[2])(dest);
    local_200 = CONCAT44(extraout_var,iVar6);
    iVar6 = (*grad->_vptr_tensor[3])(grad);
    local_208 = CONCAT44(extraout_var_00,iVar6);
    iVar6 = (*gradient_input->_vptr_tensor[2])(gradient_input);
    local_210 = CONCAT44(extraout_var_01,iVar6);
    lVar3 = grad->m_n;
    if (0 < lVar3) {
      lVar4 = grad->m_nr;
      lVar1 = num_locations * 4;
      lVar11 = num_channels * num_locations * 4;
      lVar13 = 0;
      do {
        if (mode == CHANNEL_WISE) {
          if (0 < num_locations) {
            lVar14 = 0;
            lVar8 = local_208;
            lVar17 = local_200;
            lVar12 = local_210;
            do {
              if (0 < num_channels) {
                auVar22 = ZEXT816(0) << 0x40;
                lVar16 = 0;
                lVar21 = num_channels;
                do {
                  auVar22 = vfnmadd231ss_fma(auVar22,ZEXT416(*(uint *)(lVar17 + lVar16)),
                                             ZEXT416(*(uint *)(lVar12 + lVar16)));
                  lVar16 = lVar16 + lVar1;
                  lVar21 = lVar21 + -1;
                } while (lVar21 != 0);
                if (gradient_input == grad) {
                  if (0 < num_channels) {
                    lVar16 = 0;
                    lVar21 = num_channels;
                    do {
                      *(float *)(lVar8 + lVar16) =
                           (auVar22._0_4_ + *(float *)(lVar12 + lVar16)) *
                           *(float *)(lVar17 + lVar16);
                      lVar16 = lVar16 + lVar1;
                      lVar21 = lVar21 + -1;
                    } while (lVar21 != 0);
                  }
                }
                else if (0 < num_channels) {
                  lVar16 = 0;
                  lVar21 = num_channels;
                  do {
                    auVar5 = vfmadd213ss_fma(ZEXT416((uint)(auVar22._0_4_ +
                                                           *(float *)(lVar12 + lVar16))),
                                             ZEXT416(*(uint *)(lVar17 + lVar16)),
                                             ZEXT416(*(uint *)(lVar8 + lVar16)));
                    *(int *)(lVar8 + lVar16) = auVar5._0_4_;
                    lVar16 = lVar16 + lVar1;
                    lVar21 = lVar21 + -1;
                  } while (lVar21 != 0);
                }
              }
              lVar14 = lVar14 + 1;
              lVar12 = lVar12 + 4;
              lVar17 = lVar17 + 4;
              lVar8 = lVar8 + 4;
            } while (lVar14 != num_locations);
          }
        }
        else if ((mode == PLANE_WISE) && (0 < num_channels)) {
          lVar17 = grad->m_nc;
          lVar16 = 0;
          lVar8 = lVar17 * 4;
          lVar12 = local_210;
          lVar14 = local_208;
          lVar21 = local_200;
          do {
            if (0 < lVar4) {
              lVar18 = 0;
              lVar7 = lVar12;
              lVar15 = lVar21;
              lVar19 = lVar14;
              do {
                if (0 < lVar17) {
                  auVar22 = ZEXT816(0) << 0x40;
                  lVar20 = 0;
                  do {
                    auVar22 = vfnmadd231ss_fma(auVar22,ZEXT416(*(uint *)(lVar15 + lVar20 * 4)),
                                               ZEXT416(*(uint *)(lVar7 + lVar20 * 4)));
                    lVar20 = lVar20 + 1;
                  } while (lVar17 != lVar20);
                  if (gradient_input == grad) {
                    if (0 < lVar17) {
                      lVar20 = 0;
                      do {
                        *(float *)(lVar19 + lVar20 * 4) =
                             (auVar22._0_4_ + *(float *)(lVar7 + lVar20 * 4)) *
                             *(float *)(lVar15 + lVar20 * 4);
                        lVar20 = lVar20 + 1;
                      } while (lVar17 != lVar20);
                    }
                  }
                  else if (0 < lVar17) {
                    lVar20 = 0;
                    do {
                      auVar5 = vfmadd213ss_fma(ZEXT416((uint)(auVar22._0_4_ +
                                                             *(float *)(lVar7 + lVar20 * 4))),
                                               ZEXT416(*(uint *)(lVar15 + lVar20 * 4)),
                                               ZEXT416(*(uint *)(lVar19 + lVar20 * 4)));
                      *(int *)(lVar19 + lVar20 * 4) = auVar5._0_4_;
                      lVar20 = lVar20 + 1;
                    } while (lVar17 != lVar20);
                  }
                }
                lVar18 = lVar18 + 1;
                lVar15 = lVar15 + lVar8;
                lVar7 = lVar7 + lVar8;
                lVar19 = lVar19 + lVar8;
              } while (lVar18 != lVar4);
            }
            lVar16 = lVar16 + 1;
            lVar21 = lVar21 + lVar1;
            lVar12 = lVar12 + lVar1;
            lVar14 = lVar14 + lVar1;
          } while (lVar16 != num_channels);
        }
        local_200 = local_200 + lVar11;
        local_210 = local_210 + lVar11;
        local_208 = local_208 + lVar11;
        lVar13 = lVar13 + 1;
      } while (lVar13 != lVar3);
    }
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\n\nError detected at line ",0x19);
  poVar9 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,0x6ab);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Error detected in file ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
             ,0x77);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Error detected in function ",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "void dlib::cpu::ttimpl::softmax_gradient(const long, const long, tensor &, const tensor &, const tensor &, operation_mode)"
             ,0x7a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".\n\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Failing expression was ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"have_same_dimensions(grad, gradient_input)",0x2a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".\n",2);
  puVar2 = (uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18));
  *puVar2 = *puVar2 | 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"",0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  pfVar10 = (fatal_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  fatal_error::fatal_error(pfVar10,EBROKEN_ASSERT,&local_1c8);
  __cxa_throw(pfVar10,&fatal_error::typeinfo,error::~error);
}

Assistant:

void softmax_gradient(
                const long num_locations,
                const long num_channels,
                tensor& grad,
                const tensor& dest,
                const tensor& gradient_input,
                operation_mode mode = operation_mode::CHANNEL_WISE
            )
            {
                DLIB_ASSERT(num_channels * num_locations == grad.nr() * grad.nc() * grad.k());
                DLIB_CASSERT(have_same_dimensions(grad, dest));
                DLIB_CASSERT(have_same_dimensions(grad, gradient_input));

                const auto d = dest.host();
                const auto g = grad.host();
                const auto in = gradient_input.host();
                for (long n = 0; n < grad.num_samples(); ++n)
                {
                    const auto d2 = d + num_locations * num_channels * n;
                    const auto g2 = g + num_locations * num_channels * n;
                    const auto in2 = in + num_locations * num_channels * n;

                    if (mode == operation_mode::CHANNEL_WISE)
                    {
                        for (long i = 0; i < num_locations; ++i)
                        {
                            const auto d3 = d2 + i;
                            const auto g3 = g2 + i;
                            const auto in3 = in2 + i;
                            float sum = 0.0f;
                            for (long k = 0; k < num_channels; ++k)
                                sum += -d3[k * num_locations] * in3[k * num_locations];
                            if (is_same_object(gradient_input, grad))
                            {
                                for (long k = 0; k < num_channels; ++k)
                                    g3[k * num_locations] = d3[k * num_locations] * (sum + in3[k * num_locations]);
                            }
                            else
                            {
                                for (long k = 0; k < num_channels; ++k)
                                    g3[k * num_locations] += d3[k * num_locations] * (sum + in3[k * num_locations]);
                            }
                        }
                    }
                    else if (mode == operation_mode::PLANE_WISE)
                    {
                        for (long k = 0; k < num_channels; ++k)
                        {
                            const auto d_channel = d2 + k * num_locations;
                            const auto g_channel = g2 + k * num_locations;
                            const auto in_channel = in2 + k * num_locations;
                            for (long r = 0; r < grad.nr(); ++r)
                            {
                                float sum = 0.0f;
                                for (long c = 0, idx = r * grad.nc(); c < grad.nc(); ++c, ++idx)
                                    sum += -d_channel[idx] * in_channel[idx];
                                if (is_same_object(gradient_input, grad))
                                {
                                    for (long c = 0, idx = r * grad.nc(); c < grad.nc(); ++c, ++idx)
                                        g_channel[idx] = d_channel[idx] * (sum + in_channel[idx]);
                                }
                                else
                                {
                                    for (long c = 0, idx = r * grad.nc(); c < grad.nc(); ++c, ++idx)
                                        g_channel[idx] += d_channel[idx] * (sum + in_channel[idx]);
                                }
                            }
                        }
                    }
                }
            }